

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmakemain.cxx
# Opt level: O0

int do_build(int ac,char **av)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  ulong uVar4;
  char *pcVar5;
  undefined1 local_3a8 [8];
  cmake cm;
  allocator local_121;
  string local_120;
  string local_100;
  allocator local_d9;
  value_type local_d8;
  int local_b4;
  int local_b0;
  int i;
  Doing doing;
  bool clean;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nativeOptions;
  string dir;
  allocator local_59;
  undefined1 local_58 [8];
  string config;
  string target;
  char **av_local;
  int ac_local;
  
  std::__cxx11::string::string((string *)(config.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_58,"Debug",&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::__cxx11::string::string
            ((string *)
             &nativeOptions.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&doing);
  i._3_1_ = 0;
  local_b0 = 1;
  for (local_b4 = 2; local_b4 < ac; local_b4 = local_b4 + 1) {
    if (local_b0 == 4) {
      pcVar5 = av[local_b4];
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d8,pcVar5,&local_d9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&doing,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    }
    else {
      iVar2 = strcmp(av[local_b4],"--target");
      if (iVar2 == 0) {
        local_b0 = 2;
      }
      else {
        iVar2 = strcmp(av[local_b4],"--config");
        if (iVar2 == 0) {
          local_b0 = 3;
        }
        else {
          iVar2 = strcmp(av[local_b4],"--clean-first");
          if (iVar2 == 0) {
            i._3_1_ = 1;
            local_b0 = 0;
          }
          else {
            iVar2 = strcmp(av[local_b4],"--use-stderr");
            if (iVar2 != 0) {
              iVar2 = strcmp(av[local_b4],"--");
              if (iVar2 == 0) {
                local_b0 = 4;
              }
              else if (local_b0 == 1) {
                pcVar5 = av[local_b4];
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_120,pcVar5,&local_121);
                cmsys::SystemTools::CollapseFullPath(&local_100,&local_120);
                std::__cxx11::string::operator=
                          ((string *)
                           &nativeOptions.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&local_100)
                ;
                std::__cxx11::string::~string((string *)&local_100);
                std::__cxx11::string::~string((string *)&local_120);
                std::allocator<char>::~allocator((allocator<char> *)&local_121);
                local_b0 = 0;
              }
              else if (local_b0 == 2) {
                std::__cxx11::string::operator=
                          ((string *)(config.field_2._M_local_buf + 8),av[local_b4]);
                local_b0 = 0;
              }
              else if (local_b0 == 3) {
                std::__cxx11::string::operator=((string *)local_58,av[local_b4]);
                local_b0 = 0;
              }
              else {
                poVar3 = std::operator<<((ostream *)&std::cerr,"Unknown argument ");
                poVar3 = std::operator<<(poVar3,av[local_b4]);
                std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
                std::__cxx11::string::operator=
                          ((string *)
                           &nativeOptions.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,"");
              }
            }
          }
        }
      }
    }
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    pcVar5 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmsys::SystemTools::StringStartsWith(pcVar5,".\\");
    if (bVar1) {
      std::__cxx11::string::substr((ulong)&cm.CurrentSnapshot.Position.Position,(ulong)local_58);
      std::__cxx11::string::operator=
                ((string *)local_58,(string *)&cm.CurrentSnapshot.Position.Position);
      std::__cxx11::string::~string((string *)&cm.CurrentSnapshot.Position.Position);
    }
    cmake::cmake((cmake *)local_3a8);
    av_local._4_4_ =
         cmake::Build((cmake *)local_3a8,
                      (string *)
                      &nativeOptions.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (string *)((long)&config.field_2 + 8),(string *)local_58,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&doing,(bool)(i._3_1_ & 1));
    cmake::~cmake((cmake *)local_3a8);
  }
  else {
    std::operator<<((ostream *)&std::cerr,
                    "Usage: cmake --build <dir> [options] [-- [native-options]]\nOptions:\n  <dir>          = Project binary directory to be built.\n  --target <tgt> = Build <tgt> instead of default targets.\n  --config <cfg> = For multi-configuration tools, choose <cfg>.\n  --clean-first  = Build target \'clean\' first, then build.\n                   (To clean only, use --target \'clean\'.)\n  --use-stderr   = Ignored.  Behavior is default in CMake >= 3.0.\n  --             = Pass remaining options to the native tool.\n"
                   );
    av_local._4_4_ = 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&doing);
  std::__cxx11::string::~string
            ((string *)
             &nativeOptions.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(config.field_2._M_local_buf + 8));
  return av_local._4_4_;
}

Assistant:

static int do_build(int ac, char const* const* av)
{
#ifndef CMAKE_BUILD_WITH_CMAKE
  std::cerr << "This cmake does not support --build\n";
  return -1;
#else
  std::string target;
  std::string config = "Debug";
  std::string dir;
  std::vector<std::string> nativeOptions;
  bool clean = false;

  enum Doing { DoingNone, DoingDir, DoingTarget, DoingConfig, DoingNative};
  Doing doing = DoingDir;
  for(int i=2; i < ac; ++i)
    {
    if(doing == DoingNative)
      {
      nativeOptions.push_back(av[i]);
      }
    else if(strcmp(av[i], "--target") == 0)
      {
      doing = DoingTarget;
      }
    else if(strcmp(av[i], "--config") == 0)
      {
      doing = DoingConfig;
      }
    else if(strcmp(av[i], "--clean-first") == 0)
      {
      clean = true;
      doing = DoingNone;
      }
    else if(strcmp(av[i], "--use-stderr") == 0)
      {
      /* tolerate legacy option */
      }
    else if(strcmp(av[i], "--") == 0)
      {
      doing = DoingNative;
      }
    else
      {
      switch (doing)
        {
        case DoingDir:
          dir = cmSystemTools::CollapseFullPath(av[i]);
          doing = DoingNone;
          break;
        case DoingTarget:
          target = av[i];
          doing = DoingNone;
          break;
        case DoingConfig:
          config = av[i];
          doing = DoingNone;
          break;
        default:
          std::cerr << "Unknown argument " << av[i] << std::endl;
          dir = "";
          break;
        }
      }
    }
  if(dir.empty())
    {
    std::cerr <<
      "Usage: cmake --build <dir> [options] [-- [native-options]]\n"
      "Options:\n"
      CMAKE_BUILD_OPTIONS
      ;
    return 1;
    }

  // Hack for vs6 that passes ".\Debug" as "$(IntDir)" value:
  //
  if (cmSystemTools::StringStartsWith(config.c_str(), ".\\"))
    {
    config = config.substr(2);
    }

  cmake cm;
  return cm.Build(dir, target, config, nativeOptions, clean);
#endif
}